

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args,locale_ref loc)

{
  short *pend;
  buffer_appender<char> out;
  short *end;
  short *psVar1;
  short *pbegin;
  type tVar2;
  size_t sVar3;
  size_t __n;
  code *pcVar4;
  float value;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  basic_format_specs<char> specs;
  undefined1 in_stack_00000008 [16];
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  writer write;
  undefined1 local_88 [32];
  buffer_appender<char> local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_58;
  locale_ref local_50;
  writer local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  aVar6 = args.field_1;
  pcVar5 = (char *)args.desc_;
  sVar3 = format_str.size_;
  pbegin = (short *)format_str.data_;
  if ((sVar3 != 2) || (*pbegin != 0x7d7b)) {
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    pend = (short *)((long)pbegin + sVar3);
    local_88._8_8_ = pbegin;
    local_88._16_8_ = sVar3;
    local_68.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)buf;
    local_60 = pcVar5;
    local_58 = aVar6;
    local_50.locale_ = loc.locale_;
    if (0x1f < (long)sVar3) {
      local_48.handler_ =
           (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)local_88;
      do {
        psVar1 = pbegin;
        if ((char)*pbegin != '{') {
          __n = (long)pend - ((long)pbegin + 1);
          if ((long)__n < 0) {
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
                        ,0x146,"negative value");
          }
          psVar1 = (short *)memchr((void *)((long)pbegin + 1),0x7b,__n);
          if (psVar1 == (short *)0x0) {
            parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
            ::writer::operator()(&local_48,(char *)pbegin,(char *)pend);
            return;
          }
        }
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()(&local_48,(char *)pbegin,(char *)psVar1);
        pbegin = (short *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                    ((char *)psVar1,(char *)pend,
                                     (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                      *)local_88);
        if (pbegin == pend) {
          return;
        }
      } while( true );
    }
    if (sVar3 != 0) {
      psVar1 = pbegin;
      do {
        end = (short *)((long)psVar1 + 1);
        if ((char)*psVar1 == '}') {
          if ((end == pend) || (*(char *)end != '}')) {
            pcVar5 = "unmatched \'}\' in format string";
            goto LAB_00123f37;
          }
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_88,(char *)pbegin,(char *)end);
          end = psVar1 + 1;
          pbegin = end;
        }
        else if ((char)*psVar1 == '{') {
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_88,(char *)pbegin,(char *)psVar1);
          end = (short *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                   ((char *)psVar1,(char *)pend,
                                    (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                     *)local_88);
          pbegin = end;
        }
        psVar1 = end;
      } while (end != pend);
    }
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)local_88,(char *)pbegin,(char *)pend);
    return;
  }
  if ((long)pcVar5 < 0) {
    if (((int)(type)args.desc_ < 1) || (tVar2 = (aVar6.args_)->type_, tVar2 == none_type))
    goto LAB_00123f59;
  }
  else {
    tVar2 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_00123f59:
      pcVar5 = "argument not found";
LAB_00123f37:
      error_handler::on_error((error_handler *)local_88,pcVar5);
    }
  }
  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&(aVar6.values_)->field_0;
  pcVar4 = *(code **)((long)&(aVar6.values_)->field_0 + 8);
  value = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_;
  switch(tVar2) {
  case int_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
              ((buffer_appender<char>)buf,(int)value);
    return;
  case uint_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
              ((buffer_appender<char>)buf,(uint)value);
    return;
  case long_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
              ((buffer_appender<char>)buf,
               (longlong)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case ulong_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
              ((buffer_appender<char>)buf,
               (unsigned_long_long)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case int128_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
              ((detail *)buf,out,(__int128)in_stack_00000008);
    return;
  case uint128_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
              ((detail *)buf,out,(unsigned___int128)in_stack_00000008);
    return;
  case bool_type:
    pcVar5 = "false";
    if (((ulong)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container & 1) != 0)
    {
      pcVar5 = "true";
    }
    pcVar4 = (code *)((long)&((buffer<char> *)pcVar5)->_vptr_buffer + ((ulong)((uint)value & 1) ^ 5)
                     );
    break;
  case char_type:
    write<char,fmt::v7::detail::buffer_appender<char>>
              ((buffer_appender<char>)buf,
               (char)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case float_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>((buffer_appender<char>)buf,value);
    return;
  case double_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
              ((buffer_appender<char>)buf,
               (double)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case last_numeric_type:
    specs.type = '\0';
    specs._9_1_ = 0;
    specs.fill.data_[0] = ' ';
    specs.fill.data_[1] = '\0';
    specs.fill.data_[2] = '\0';
    specs.fill.data_[3] = '\0';
    specs.fill.size_ = '\x01';
    specs._15_1_ = 0;
    specs.width = 0;
    specs.precision = -1;
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
              ((buffer_appender<char>)buf,((aVar6.values_)->field_0).long_double_value,specs,
               (locale_ref)0x0);
    return;
  case cstring_type:
    write<char,fmt::v7::detail::buffer_appender<char>>
              ((buffer_appender<char>)buf,
               (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case string_type:
    pcVar4 = pcVar4 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
    ;
    pcVar5 = (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    break;
  case pointer_type:
    write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
              ((buffer_appender<char>)buf,
               (unsigned_long)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               (basic_format_specs<char> *)0x0);
    return;
  case custom_type:
    local_48.handler_ =
         (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    local_88._0_8_ = buf;
    local_88._8_8_ = pcVar5;
    local_88._16_8_ = aVar6;
    local_88._24_8_ = loc.locale_;
    (*pcVar4)(out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_48);
    return;
  default:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/format.h"
                ,0x7d7,"");
  }
  buffer<char>::append<char>(buf,pcVar5,(char *)pcVar4);
  return;
}

Assistant:

void detail::vformat_to(
    detail::buffer<Char>& buf, basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args,
    detail::locale_ref loc) {
  using iterator = typename buffer_context<Char>::iterator;
  auto out = buffer_appender<Char>(buf);
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<iterator, Char>{out, args, loc},
                     arg);
    return;
  }
  format_handler<iterator, Char, buffer_context<Char>> h(out, format_str, args,
                                                         loc);
  parse_format_string<false>(format_str, h);
}